

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(UdpSocket_*,_void_*)> * __thiscall
SslUdpSocket::BindFuncSslInitDone
          (function<void_(UdpSocket_*,_void_*)> *__return_storage_ptr__,SslUdpSocket *this,
          function<void_(UdpSocket_*,_void_*)> *fSllInitDone)

{
  BaseSocketImpl *pBVar1;
  SslUdpSocketImpl *local_68;
  function<void_(UdpSocket_*,_void_*)> local_40;
  function<void_(UdpSocket_*,_void_*)> *local_20;
  function<void_(UdpSocket_*,_void_*)> *fSllInitDone_local;
  SslUdpSocket *this_local;
  
  local_20 = fSllInitDone;
  fSllInitDone_local = (function<void_(UdpSocket_*,_void_*)> *)this;
  this_local = (SslUdpSocket *)__return_storage_ptr__;
  pBVar1 = BaseSocket::GetImpl((BaseSocket *)this);
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    local_68 = (SslUdpSocketImpl *)0x0;
  }
  else {
    local_68 = (SslUdpSocketImpl *)
               __dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&SslUdpSocketImpl::typeinfo,0);
  }
  std::function<void_(UdpSocket_*,_void_*)>::function(&local_40,fSllInitDone);
  SslUdpSocketImpl::BindFuncSslInitDone(__return_storage_ptr__,local_68,&local_40);
  std::function<void_(UdpSocket_*,_void_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(UdpSocket*, void*)> SslUdpSocket::BindFuncSslInitDone(std::function<void(UdpSocket*, void*)> fSllInitDone)
{
    return dynamic_cast<SslUdpSocketImpl*>(GetImpl())->BindFuncSslInitDone(fSllInitDone);
}